

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::DebuggerScope::FindCommonAncestor(DebuggerScope *this,DebuggerScope *debuggerScope)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  DebuggerScope *pDVar6;
  DebuggerScope **local_58;
  DebuggerScope **nodeToBringUp;
  int depthDifference;
  int secondDepth;
  int firstDepth;
  DebuggerScope *secondNode;
  DebuggerScope *firstNode;
  DebuggerScope *debuggerScope_local;
  DebuggerScope *this_local;
  
  firstNode = debuggerScope;
  debuggerScope_local = this;
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x17ee,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this == firstNode) {
    this_local = firstNode;
  }
  else {
    bVar2 = IsAncestorOf(this,firstNode);
    this_local = this;
    if (!bVar2) {
      bVar2 = IsAncestorOf(firstNode,this);
      if (bVar2) {
        this_local = firstNode;
      }
      else {
        _secondDepth = firstNode;
        secondNode = this;
        iVar3 = GetScopeDepth(this);
        iVar4 = GetScopeDepth(_secondDepth);
        nodeToBringUp._4_4_ = iVar3 - iVar4;
        if (nodeToBringUp._4_4_ < 1) {
          nodeToBringUp._4_4_ = -nodeToBringUp._4_4_;
        }
        if (iVar4 < iVar3) {
          local_58 = &secondNode;
        }
        else {
          local_58 = (DebuggerScope **)&secondDepth;
        }
        for (; 0 < nodeToBringUp._4_4_; nodeToBringUp._4_4_ = nodeToBringUp._4_4_ + -1) {
          if (*local_58 == (DebuggerScope *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0x180c,"(nodeToBringUp)","nodeToBringUp");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          pDVar6 = GetParentScope(*local_58);
          *local_58 = pDVar6;
        }
        for (; secondNode != (DebuggerScope *)0x0 && _secondDepth != (DebuggerScope *)0x0;
            _secondDepth = GetParentScope(_secondDepth)) {
          if (secondNode == _secondDepth) {
            return secondNode;
          }
          secondNode = GetParentScope(secondNode);
        }
        this_local = (DebuggerScope *)0x0;
      }
    }
  }
  return this_local;
}

Assistant:

DebuggerScope* DebuggerScope::FindCommonAncestor(DebuggerScope* debuggerScope)
    {
        AnalysisAssert(debuggerScope);

        if (this == debuggerScope)
        {
            return debuggerScope;
        }

        if (this->IsAncestorOf(debuggerScope))
        {
            return this;
        }

        if (debuggerScope->IsAncestorOf(this))
        {
            return debuggerScope;
        }

        DebuggerScope* firstNode = this;
        DebuggerScope* secondNode = debuggerScope;

        int firstDepth = firstNode->GetScopeDepth();
        int secondDepth = secondNode->GetScopeDepth();

        // Calculate the depth difference in order to bring the deep node up to the sibling
        // level of the shorter node.
        int depthDifference = abs(firstDepth - secondDepth);

        DebuggerScope*& nodeToBringUp = firstDepth > secondDepth ? firstNode : secondNode;
        while (depthDifference > 0)
        {
            AnalysisAssert(nodeToBringUp);
            nodeToBringUp = nodeToBringUp->GetParentScope();
            --depthDifference;
        }

        // Move up the tree and see where the nodes meet.
        while (firstNode && secondNode)
        {
            if (firstNode == secondNode)
            {
                return firstNode;
            }

            firstNode = firstNode->GetParentScope();
            secondNode = secondNode->GetParentScope();
        }

        // The nodes are not part of the same scope tree.
        return nullptr;
    }